

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O3

char * __thiscall io::LineReader::next_line(LineReader *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *puVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  _Head_base<0UL,_char_*,_false> _Var10;
  long lVar11;
  bool bVar12;
  undefined1 local_238 [256];
  char local_138 [255];
  undefined1 local_39;
  uint local_38;
  
  iVar7 = this->data_begin;
  iVar4 = this->data_end;
  if (iVar7 == iVar4) {
    pcVar5 = (char *)0x0;
  }
  else {
    this->file_line = this->file_line + 1;
    if (iVar4 <= iVar7) {
      __assert_fail("data_begin < data_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/fast-cpp-csv-parser/csv.h"
                    ,0x1ba,"char *io::LineReader::next_line()");
    }
    if (0x2000000 < iVar4) {
      __assert_fail("data_end <= block_len*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Joeppie[P]Backproject/thirdparty/fast-cpp-csv-parser/csv.h"
                    ,0x1bb,"char *io::LineReader::next_line()");
    }
    if (0xffffff < iVar7) {
      _Var10._M_head_impl =
           (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      memcpy(_Var10._M_head_impl,_Var10._M_head_impl + 0x1000000,0x1000000);
      iVar7 = this->data_begin + -0x1000000;
      this->data_begin = iVar7;
      iVar4 = this->data_end + -0x1000000;
      this->data_end = iVar4;
      if ((this->reader).byte_source._M_t.
          super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
          super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
          super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl != (ByteSourceBase *)0x0)
      {
        iVar7 = detail::AsynchronousReader::finish_read(&this->reader);
        this->data_end = this->data_end + iVar7;
        _Var10._M_head_impl =
             (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
        memcpy(_Var10._M_head_impl + 0x1000000,_Var10._M_head_impl + 0x2000000,0x1000000);
        detail::AsynchronousReader::start_read
                  (&this->reader,
                   (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                   _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x2000000,0x1000000);
        iVar7 = this->data_begin;
        iVar4 = this->data_end;
      }
    }
    lVar8 = (long)iVar7;
    _Var10._M_head_impl =
         (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    lVar9 = (lVar8 << 0x20) + -0x100000000;
    lVar11 = 0;
    do {
      lVar9 = lVar9 + 0x100000000;
      cVar2 = _Var10._M_head_impl[lVar11 + lVar8];
      lVar1 = lVar11 + 1;
      if (cVar2 == '\n') break;
      bVar12 = iVar4 - lVar8 != lVar11;
      lVar11 = lVar1;
    } while (bVar12);
    iVar3 = (int)lVar1;
    if (0xffffff < iVar3 + -1) {
      strncpy(local_138,this->file_name,0xff);
      local_39 = 0;
      local_38 = this->file_line;
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x210);
      *puVar6 = &PTR__exception_001206e0;
      memcpy(puVar6 + 1,local_238,0x100);
      memcpy(puVar6 + 0x21,local_138,0x100);
      *(uint *)(puVar6 + 0x41) = local_38;
      *puVar6 = &PTR__exception_001207f0;
      __cxa_throw(puVar6,&error::line_length_limit_exceeded::typeinfo,std::exception::~exception);
    }
    if (cVar2 != '\n') {
      this->data_end = iVar4 + 1;
    }
    _Var10._M_head_impl[lVar1 + lVar8 + -1] = '\0';
    iVar4 = this->data_begin;
    _Var10._M_head_impl =
         (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (iVar3 + (iVar7 - iVar4) == 1) {
      iVar4 = iVar7 + -1 + iVar3;
    }
    else if (_Var10._M_head_impl[(lVar9 >> 0x20) + -1] == '\r') {
      _Var10._M_head_impl[(lVar9 >> 0x20) + -1] = '\0';
      _Var10._M_head_impl =
           (this->buffer)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
      iVar4 = this->data_begin;
    }
    pcVar5 = _Var10._M_head_impl + iVar4;
    this->data_begin = iVar7 + iVar3;
  }
  return pcVar5;
}

Assistant:

char*next_line(){
                        if(data_begin == data_end)
                                return 0;

                        ++file_line;

                        assert(data_begin < data_end);
                        assert(data_end <= block_len*2);

                        if(data_begin >= block_len){
                                std::memcpy(buffer.get(), buffer.get()+block_len, block_len);
                                data_begin -= block_len;
                                data_end -= block_len;
                                if(reader.is_valid())
                                {
                                        data_end += reader.finish_read();
                                        std::memcpy(buffer.get()+block_len, buffer.get()+2*block_len, block_len);
                                        reader.start_read(buffer.get() + 2*block_len, block_len);
                                }
                        }

                        int line_end = data_begin;
                        while(buffer[line_end] != '\n' && line_end != data_end){
                                ++line_end;
                        }

                        if(line_end - data_begin + 1 > block_len){
                                error::line_length_limit_exceeded err;
                                err.set_file_name(file_name);
                                err.set_file_line(file_line);
                                throw err;
                        }

                        if(buffer[line_end] == '\n'){
                                buffer[line_end] = '\0';
                        }else{
                                // some files are missing the newline at the end of the
                                // last line
                                ++data_end;
                                buffer[line_end] = '\0';
                        }

                        // handle windows \r\n-line breaks
                        if(line_end != data_begin && buffer[line_end-1] == '\r')
                                buffer[line_end-1] = '\0';

                        char*ret = buffer.get() + data_begin;
                        data_begin = line_end+1;
                        return ret;
                }